

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTable.c
# Opt level: O0

void Map_SuperTableSortSupergatesByDelay(Map_HashTable_t *p,int nSupersMax)

{
  int iVar1;
  Map_Super_t **ppS1;
  int local_3c;
  int local_38;
  int k;
  int i;
  int nSupers;
  Map_Super_t *pSuper;
  Map_Super_t **ppSupers;
  Map_HashEntry_t *pEnt;
  int nSupersMax_local;
  Map_HashTable_t *p_local;
  
  ppS1 = (Map_Super_t **)malloc((long)nSupersMax << 3);
  local_38 = 0;
  do {
    if (p->nBins <= local_38) {
      if (ppS1 != (Map_Super_t **)0x0) {
        free(ppS1);
      }
      return;
    }
    for (ppSupers = (Map_Super_t **)p->pBins[local_38]; ppSupers != (Map_Super_t **)0x0;
        ppSupers = (Map_Super_t **)ppSupers[3]) {
      k = 0;
      for (_i = ppSupers[2]; _i != (Map_Super_t *)0x0; _i = _i->pNext) {
        ppS1[k] = _i;
        k = k + 1;
      }
      ppSupers[2] = (Map_Super_t *)0x0;
      if (k != 0) {
        qsort(ppS1,(long)k,8,Map_SuperTableCompareGatesInList);
        iVar1 = Map_SuperTableCompareGatesInList(ppS1,ppS1 + (long)k + -1);
        if (0 < iVar1) {
          __assert_fail("Map_SuperTableCompareGatesInList( ppSupers, ppSupers + nSupers - 1 ) <= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTable.c"
                        ,0x184,"void Map_SuperTableSortSupergatesByDelay(Map_HashTable_t *, int)");
        }
        for (local_3c = 0; local_3c < k; local_3c = local_3c + 1) {
          ppS1[local_3c]->pNext = ppSupers[2];
          ppSupers[2] = ppS1[local_3c];
        }
        *(uint *)&ppSupers[2]->field_0x4 =
             *(uint *)&ppSupers[2]->field_0x4 & 0xf0000fff | (k & 0xffffU) << 0xc;
      }
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void Map_SuperTableSortSupergatesByDelay( Map_HashTable_t * p, int nSupersMax )
{
    Map_HashEntry_t * pEnt;
    Map_Super_t ** ppSupers;
    Map_Super_t * pSuper;
    int nSupers, i, k;

    ppSupers = ABC_ALLOC( Map_Super_t *, nSupersMax );
    for ( i = 0; i < p->nBins; i++ )
        for ( pEnt = p->pBins[i]; pEnt; pEnt = pEnt->pNext )
        {
            // collect the gates in this entry
            nSupers = 0;
            for ( pSuper = pEnt->pGates; pSuper; pSuper = pSuper->pNext )
            {
                // skip supergates, whose root is the AND gate
//                if ( strcmp( Mio_GateReadName(pSuper->pRoot), "and" ) == 0 )
//                    continue;
                ppSupers[nSupers++] = pSuper;
            }
            pEnt->pGates = NULL;
            if ( nSupers == 0 )
                continue;
            // sort the gates by delay
            qsort( (void *)ppSupers, (size_t)nSupers, sizeof(Map_Super_t *), 
                    (int (*)(const void *, const void *)) Map_SuperTableCompareGatesInList );
            assert( Map_SuperTableCompareGatesInList( ppSupers, ppSupers + nSupers - 1 ) <= 0 );
            // link them in the reverse order
            for ( k = 0; k < nSupers; k++ )
            {
                ppSupers[k]->pNext = pEnt->pGates;
                pEnt->pGates = ppSupers[k];
            }
            // save the number of supergates in the list
            pEnt->pGates->nSupers = nSupers;
        }
    ABC_FREE( ppSupers );
}